

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutation.cpp
# Opt level: O0

ostream * operator<<(ostream *out,Permutation *permutation)

{
  string local_68;
  string local_38;
  Permutation *local_18;
  Permutation *permutation_local;
  ostream *out_local;
  
  local_18 = permutation;
  permutation_local = (Permutation *)out;
  if (Options::output_type == 0) {
    Permutation::ToString_abi_cxx11_(&local_38,permutation);
    std::operator<<(out,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else if (Options::output_type == 1) {
    Permutation::ToLaTex_abi_cxx11_(&local_68,permutation);
    std::operator<<(out,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return (ostream *)permutation_local;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Permutation& permutation) {
  if (Options::output_type == Options::OutputType::Standard) {
    out << permutation.ToString();
  } else if (Options::output_type == Options::OutputType::LaTex) {
    out << permutation.ToLaTex();
  }

  return out;
}